

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

OPJ_BOOL opj_jp2_read_colr(opj_jp2_t *jp2,OPJ_BYTE *p_colr_header_data,OPJ_UINT32 p_colr_header_size
                          ,opj_event_mgr_t *p_manager)

{
  OPJ_BYTE *pOVar1;
  char *fmt;
  OPJ_UINT32 OVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  OPJ_UINT32 l_value;
  OPJ_UINT32 rb;
  OPJ_UINT32 oa;
  OPJ_UINT32 ra;
  OPJ_UINT32 ol;
  OPJ_UINT32 il;
  OPJ_UINT32 ob;
  
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x5bb,
                  "OPJ_BOOL opj_jp2_read_colr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_colr_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_colr_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x5bc,
                  "OPJ_BOOL opj_jp2_read_colr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                  ,0x5bd,
                  "OPJ_BOOL opj_jp2_read_colr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_colr_header_size < 3) {
    fmt = "Bad COLR header box (bad size)\n";
LAB_0011d1c1:
    opj_event_msg(p_manager,1,fmt);
    return 0;
  }
  if ((jp2->color).jp2_has_colr != '\0') {
    opj_event_msg(p_manager,4,
                  "A conforming JP2 reader shall ignore all Colour Specification boxes after the first, so we ignore this one.\n"
                 );
    return 1;
  }
  opj_read_bytes_LE(p_colr_header_data,&jp2->meth,1);
  opj_read_bytes_LE(p_colr_header_data + 1,&jp2->precedence,1);
  opj_read_bytes_LE(p_colr_header_data + 2,&jp2->approx,1);
  uVar4 = jp2->meth;
  if (uVar4 == 2) {
    uVar4 = p_colr_header_size - 3;
    (jp2->color).icc_profile_len = uVar4;
    pOVar1 = (OPJ_BYTE *)opj_calloc(1,(long)(int)uVar4);
    (jp2->color).icc_profile_buf = pOVar1;
    if (pOVar1 == (OPJ_BYTE *)0x0) {
      (jp2->color).icc_profile_len = 0;
      return 0;
    }
    uVar3 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar3;
    }
    for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      opj_read_bytes_LE(p_colr_header_data + 3 + uVar3,&l_value,1);
      (jp2->color).icc_profile_buf[uVar3] = (OPJ_BYTE)l_value;
    }
  }
  else {
    if (uVar4 != 1) {
      if (2 < uVar4) {
        opj_event_msg(p_manager,4,
                      "COLR BOX meth value is not a regular value (%d), so we will ignore the entire Colour Specification box. \n"
                     );
      }
      if ((jp2->color).jp2_has_colr == '\0') {
        return 1;
      }
      goto LAB_0011d4c4;
    }
    if (p_colr_header_size < 7) {
      opj_event_msg(p_manager,1,"Bad COLR header box (bad size: %d)\n",(ulong)p_colr_header_size);
      return 0;
    }
    if ((p_colr_header_size != 7) && (jp2->enumcs != 0xe)) {
      opj_event_msg(p_manager,2,"Bad COLR header box (bad size: %d)\n");
    }
    opj_read_bytes_LE(p_colr_header_data + 3,&jp2->enumcs,4);
    if (jp2->enumcs != 0xe) goto LAB_0011d4b9;
    pOVar1 = (OPJ_BYTE *)opj_malloc(0x24);
    if (pOVar1 == (OPJ_BYTE *)0x0) {
      fmt = "Not enough memory for cielab\n";
      goto LAB_0011d1c1;
    }
    pOVar1[0] = '\x0e';
    pOVar1[1] = '\0';
    pOVar1[2] = '\0';
    pOVar1[3] = '\0';
    ob = 0;
    oa = 0;
    ol = 0;
    rb = 0;
    ra = 0;
    l_value = 0;
    il = 0x443530;
    pOVar1[4] = '\0';
    pOVar1[5] = 'F';
    pOVar1[6] = 'E';
    pOVar1[7] = 'D';
    OVar2 = 0x443530;
    if (p_colr_header_size == 7) {
LAB_0011d48a:
      ob = 0;
      oa = 0;
      ol = 0;
      rb = 0;
      ra = 0;
      l_value = 0;
    }
    else {
      if (p_colr_header_size != 0x23) {
        opj_event_msg(p_manager,2,"Bad COLR header box (CIELab, bad size: %d)\n");
        goto LAB_0011d48a;
      }
      opj_read_bytes_LE(p_colr_header_data + 7,&l_value,4);
      opj_read_bytes_LE(p_colr_header_data + 0xb,&ol,4);
      opj_read_bytes_LE(p_colr_header_data + 0xf,&ra,4);
      opj_read_bytes_LE(p_colr_header_data + 0x13,&oa,4);
      opj_read_bytes_LE(p_colr_header_data + 0x17,&rb,4);
      opj_read_bytes_LE(p_colr_header_data + 0x1b,&ob,4);
      opj_read_bytes_LE(p_colr_header_data + 0x1f,&il,4);
      pOVar1[4] = '\0';
      pOVar1[5] = '\0';
      pOVar1[6] = '\0';
      pOVar1[7] = '\0';
      OVar2 = il;
    }
    *(OPJ_UINT32 *)(pOVar1 + 8) = l_value;
    *(OPJ_UINT32 *)(pOVar1 + 0x10) = ra;
    *(OPJ_UINT32 *)(pOVar1 + 0x18) = rb;
    *(OPJ_UINT32 *)(pOVar1 + 0xc) = ol;
    *(OPJ_UINT32 *)(pOVar1 + 0x14) = oa;
    *(OPJ_UINT32 *)(pOVar1 + 0x1c) = ob;
    *(OPJ_UINT32 *)(pOVar1 + 0x20) = OVar2;
    (jp2->color).icc_profile_buf = pOVar1;
    (jp2->color).icc_profile_len = 0;
  }
LAB_0011d4b9:
  (jp2->color).jp2_has_colr = '\x01';
LAB_0011d4c4:
  jp2->j2k->enumcs = jp2->enumcs;
  return 1;
}

Assistant:

static OPJ_BOOL opj_jp2_read_colr(opj_jp2_t *jp2,
                                  OPJ_BYTE * p_colr_header_data,
                                  OPJ_UINT32 p_colr_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    OPJ_UINT32 l_value;

    /* preconditions */
    assert(jp2 != 00);
    assert(p_colr_header_data != 00);
    assert(p_manager != 00);

    if (p_colr_header_size < 3) {
        opj_event_msg(p_manager, EVT_ERROR, "Bad COLR header box (bad size)\n");
        return OPJ_FALSE;
    }

    /* Part 1, I.5.3.3 : 'A conforming JP2 reader shall ignore all Colour
     * Specification boxes after the first.'
    */
    if (jp2->color.jp2_has_colr) {
        opj_event_msg(p_manager, EVT_INFO,
                      "A conforming JP2 reader shall ignore all Colour Specification boxes after the first, so we ignore this one.\n");
        p_colr_header_data += p_colr_header_size;
        return OPJ_TRUE;
    }

    opj_read_bytes(p_colr_header_data, &jp2->meth, 1);          /* METH */
    ++p_colr_header_data;

    opj_read_bytes(p_colr_header_data, &jp2->precedence, 1);    /* PRECEDENCE */
    ++p_colr_header_data;

    opj_read_bytes(p_colr_header_data, &jp2->approx, 1);        /* APPROX */
    ++p_colr_header_data;

    if (jp2->meth == 1) {
        if (p_colr_header_size < 7) {
            opj_event_msg(p_manager, EVT_ERROR, "Bad COLR header box (bad size: %d)\n",
                          p_colr_header_size);
            return OPJ_FALSE;
        }
        if ((p_colr_header_size > 7) &&
                (jp2->enumcs != 14)) { /* handled below for CIELab) */
            /* testcase Altona_Technical_v20_x4.pdf */
            opj_event_msg(p_manager, EVT_WARNING, "Bad COLR header box (bad size: %d)\n",
                          p_colr_header_size);
        }

        opj_read_bytes(p_colr_header_data, &jp2->enumcs, 4);        /* EnumCS */

        p_colr_header_data += 4;

        if (jp2->enumcs == 14) { /* CIELab */
            OPJ_UINT32 *cielab;
            OPJ_UINT32 rl, ol, ra, oa, rb, ob, il;

            cielab = (OPJ_UINT32*)opj_malloc(9 * sizeof(OPJ_UINT32));
            if (cielab == NULL) {
                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory for cielab\n");
                return OPJ_FALSE;
            }
            cielab[0] = 14; /* enumcs */

            /* default values */
            rl = ra = rb = ol = oa = ob = 0;
            il = 0x00443530; /* D50 */
            cielab[1] = 0x44454600;/* DEF */

            if (p_colr_header_size == 35) {
                opj_read_bytes(p_colr_header_data, &rl, 4);
                p_colr_header_data += 4;
                opj_read_bytes(p_colr_header_data, &ol, 4);
                p_colr_header_data += 4;
                opj_read_bytes(p_colr_header_data, &ra, 4);
                p_colr_header_data += 4;
                opj_read_bytes(p_colr_header_data, &oa, 4);
                p_colr_header_data += 4;
                opj_read_bytes(p_colr_header_data, &rb, 4);
                p_colr_header_data += 4;
                opj_read_bytes(p_colr_header_data, &ob, 4);
                p_colr_header_data += 4;
                opj_read_bytes(p_colr_header_data, &il, 4);
                p_colr_header_data += 4;

                cielab[1] = 0;
            } else if (p_colr_header_size != 7) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Bad COLR header box (CIELab, bad size: %d)\n", p_colr_header_size);
            }
            cielab[2] = rl;
            cielab[4] = ra;
            cielab[6] = rb;
            cielab[3] = ol;
            cielab[5] = oa;
            cielab[7] = ob;
            cielab[8] = il;

            jp2->color.icc_profile_buf = (OPJ_BYTE*)cielab;
            jp2->color.icc_profile_len = 0;
        }
        jp2->color.jp2_has_colr = 1;
    } else if (jp2->meth == 2) {
        /* ICC profile */
        OPJ_INT32 it_icc_value = 0;
        OPJ_INT32 icc_len = (OPJ_INT32)p_colr_header_size - 3;

        jp2->color.icc_profile_len = (OPJ_UINT32)icc_len;
        jp2->color.icc_profile_buf = (OPJ_BYTE*) opj_calloc(1, (size_t)icc_len);
        if (!jp2->color.icc_profile_buf) {
            jp2->color.icc_profile_len = 0;
            return OPJ_FALSE;
        }

        for (it_icc_value = 0; it_icc_value < icc_len; ++it_icc_value) {
            opj_read_bytes(p_colr_header_data, &l_value, 1);    /* icc values */
            ++p_colr_header_data;
            jp2->color.icc_profile_buf[it_icc_value] = (OPJ_BYTE) l_value;
        }

        jp2->color.jp2_has_colr = 1;
    } else if (jp2->meth > 2) {
        /*  ISO/IEC 15444-1:2004 (E), Table I.9 Legal METH values:
        conforming JP2 reader shall ignore the entire Colour Specification box.*/
        opj_event_msg(p_manager, EVT_INFO,
                      "COLR BOX meth value is not a regular value (%d), "
                      "so we will ignore the entire Colour Specification box. \n", jp2->meth);
    }
    if (jp2->color.jp2_has_colr) {
        jp2->j2k->enumcs = jp2->enumcs;
    }
    return OPJ_TRUE;
}